

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::message_verify::test_method(message_verify *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffff878;
  lazy_ostream *in_stack_fffffffffffff880;
  char *in_stack_fffffffffffff888;
  const_string *in_stack_fffffffffffff8a0;
  undefined1 *in_stack_fffffffffffff8a8;
  const_string *in_stack_fffffffffffff8b0;
  string *in_stack_fffffffffffff8b8;
  string *message;
  string *in_stack_fffffffffffff8c0;
  string *signature;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 local_544 [5];
  undefined1 local_53f [2];
  const_string local_53d;
  undefined1 local_528 [32];
  undefined1 local_508 [36];
  undefined1 local_4e4 [6];
  allocator<char> local_4de;
  allocator<char> local_4dd;
  MessageVerificationResult local_4dc;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [68];
  undefined1 local_484 [6];
  allocator<char> local_47e;
  allocator<char> local_47d;
  MessageVerificationResult local_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [68];
  undefined1 local_424 [6];
  allocator<char> local_41e;
  allocator<char> local_41d;
  MessageVerificationResult local_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [68];
  undefined1 local_3c4 [6];
  allocator<char> local_3be;
  allocator<char> local_3bd;
  MessageVerificationResult local_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [68];
  undefined1 local_364 [6];
  allocator<char> local_35e;
  allocator<char> local_35d;
  MessageVerificationResult local_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [68];
  undefined1 local_304 [6];
  allocator<char> local_2fe;
  allocator<char> local_2fd;
  MessageVerificationResult local_2fc;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [736];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
               (size_t)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff880,(char (*) [1])in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    local_2fc = MessageVerify(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                              in_stack_fffffffffffff8b8);
    local_304._0_4_ = 0;
    in_stack_fffffffffffff888 = "MessageVerificationResult::ERR_INVALID_ADDRESS";
    in_stack_fffffffffffff880 = (lazy_ostream *)local_304;
    in_stack_fffffffffffff878 =
         "MessageVerify( \"invalid address\", \"signature should be irrelevant\", \"message too\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
              (local_2e8,local_2f8,0x66a,1,2,&local_2fc);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator((allocator<char> *)(local_304 + 5));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator(&local_2fe);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator(&local_2fd);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff878);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
               (size_t)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff880,(char (*) [1])in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    local_35c = MessageVerify(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                              in_stack_fffffffffffff8b8);
    local_364._0_4_ = 1;
    in_stack_fffffffffffff888 = "MessageVerificationResult::ERR_ADDRESS_NO_KEY";
    in_stack_fffffffffffff880 = (lazy_ostream *)local_364;
    in_stack_fffffffffffff878 =
         "MessageVerify( \"3B5fQsEXEaV8v6U3ejYc8XaKXAkyQj2MjV\", \"signature should be irrelevant\", \"message too\")"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
              (local_348,local_358,0x671,1,2,&local_35c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator((allocator<char> *)(local_364 + 5));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator(&local_35e);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator(&local_35d);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff878);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
               (size_t)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff880,(char (*) [1])in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    local_3bc = MessageVerify(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                              in_stack_fffffffffffff8b8);
    local_3c4._0_4_ = 2;
    in_stack_fffffffffffff888 = "MessageVerificationResult::ERR_MALFORMED_SIGNATURE";
    in_stack_fffffffffffff880 = (lazy_ostream *)local_3c4;
    in_stack_fffffffffffff878 =
         "MessageVerify( \"1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm\", \"invalid signature, not in base64 encoding\", \"message should be irrelevant\")"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
              (local_3a8,local_3b8,0x678,1,2,&local_3bc);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator((allocator<char> *)(local_3c4 + 5));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator(&local_3be);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator(&local_3bd);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff878);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
               (size_t)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff880,(char (*) [1])in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    local_41c = MessageVerify(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                              in_stack_fffffffffffff8b8);
    local_424._0_4_ = 3;
    in_stack_fffffffffffff888 = "MessageVerificationResult::ERR_PUBKEY_NOT_RECOVERED";
    in_stack_fffffffffffff880 = (lazy_ostream *)local_424;
    in_stack_fffffffffffff878 =
         "MessageVerify( \"1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm\", \"AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA=\", \"message should be irrelevant\")"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
              (local_408,local_418,0x67f,1,2,&local_41c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator((allocator<char> *)(local_424 + 5));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator(&local_41e);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator(&local_41d);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff878);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
               (size_t)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff880,(char (*) [1])in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    local_47c = MessageVerify(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                              in_stack_fffffffffffff8b8);
    local_484._0_4_ = 4;
    in_stack_fffffffffffff888 = "MessageVerificationResult::ERR_NOT_SIGNED";
    in_stack_fffffffffffff880 = (lazy_ostream *)local_484;
    in_stack_fffffffffffff878 =
         "MessageVerify( \"15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs\", \"IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=\", \"I never signed this\")"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
              (local_468,local_478,0x686,1,2,&local_47c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator((allocator<char> *)(local_484 + 5));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator(&local_47e);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator(&local_47d);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff878);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
               (size_t)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff880,(char (*) [1])in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               (allocator<char> *)in_stack_fffffffffffff8b8);
    local_4dc = MessageVerify(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                              in_stack_fffffffffffff8b8);
    local_4e4._0_4_ = 5;
    in_stack_fffffffffffff888 = "MessageVerificationResult::OK";
    in_stack_fffffffffffff880 = (lazy_ostream *)local_4e4;
    in_stack_fffffffffffff878 =
         "MessageVerify( \"15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs\", \"IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=\", \"Trust no one\")"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
              (local_4c8,local_4d8,0x68d,1,2,&local_4dc);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator((allocator<char> *)(local_4e4 + 5));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator(&local_4de);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator(&local_4dd);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff878);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    signature = (string *)(local_508 + 0x10);
    message = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff878);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)message,in_stack_fffffffffffff8b0,
               (size_t)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff880,(char (*) [1])in_stack_fffffffffffff878);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff888,
               (pointer)in_stack_fffffffffffff880,(unsigned_long)in_stack_fffffffffffff878);
    in_stack_fffffffffffff8b0 = &local_53d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)signature,(allocator<char> *)message);
    in_stack_fffffffffffff8a8 = local_53f + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)signature,(allocator<char> *)message);
    in_stack_fffffffffffff8a0 = (const_string *)local_53f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)signature,(allocator<char> *)message);
    local_53d.m_begin._1_4_ = MessageVerify(this_00,signature,message);
    local_544._0_4_ = 5;
    in_stack_fffffffffffff888 = "MessageVerificationResult::OK";
    in_stack_fffffffffffff880 = (lazy_ostream *)local_544;
    in_stack_fffffffffffff878 =
         "MessageVerify( \"11canuhp9X2NocwCq7xNrQYTmUgZAnLK3\", \"IIcaIENoYW5jZWxsb3Igb24gYnJpbmsgb2Ygc2Vjb25kIGJhaWxvdXQgZm9yIGJhbmtzIAaHRtbCeDZINyavx14=\", \"Trust me\")"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
              (local_528,(undefined1 *)((long)&local_53d.m_begin + 5),0x694,1,2,
               (undefined1 *)((long)&local_53d.m_begin + 1));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator((allocator<char> *)local_53f);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator((allocator<char> *)(local_53f + 1));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff878);
    std::allocator<char>::~allocator((allocator<char> *)&local_53d);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff878);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(message_verify)
{
    BOOST_CHECK_EQUAL(
        MessageVerify(
            "invalid address",
            "signature should be irrelevant",
            "message too"),
        MessageVerificationResult::ERR_INVALID_ADDRESS);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "3B5fQsEXEaV8v6U3ejYc8XaKXAkyQj2MjV",
            "signature should be irrelevant",
            "message too"),
        MessageVerificationResult::ERR_ADDRESS_NO_KEY);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm",
            "invalid signature, not in base64 encoding",
            "message should be irrelevant"),
        MessageVerificationResult::ERR_MALFORMED_SIGNATURE);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm",
            "AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA=",
            "message should be irrelevant"),
        MessageVerificationResult::ERR_PUBKEY_NOT_RECOVERED);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs",
            "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=",
            "I never signed this"),
        MessageVerificationResult::ERR_NOT_SIGNED);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs",
            "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=",
            "Trust no one"),
        MessageVerificationResult::OK);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "11canuhp9X2NocwCq7xNrQYTmUgZAnLK3",
            "IIcaIENoYW5jZWxsb3Igb24gYnJpbmsgb2Ygc2Vjb25kIGJhaWxvdXQgZm9yIGJhbmtzIAaHRtbCeDZINyavx14=",
            "Trust me"),
        MessageVerificationResult::OK);
}